

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

PLYProperty * __thiscall gvr::PLYElement::findProperty(PLYElement *this,string *s)

{
  int iVar1;
  size_type sVar2;
  reference this_00;
  string *psVar3;
  long in_RDI;
  size_t i;
  PLYProperty *ret;
  ulong local_20;
  reference local_18;
  
  local_18 = (reference)0x0;
  for (local_20 = 0;
      sVar2 = std::
              vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
              ::size((vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                      *)(in_RDI + 0x28)), local_20 < sVar2 && local_18 == (reference)0x0;
      local_20 = local_20 + 1) {
    this_00 = std::
              vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
              ::operator[]((vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                            *)(in_RDI + 0x28),local_20);
    psVar3 = (anonymous_namespace)::PLYProperty::getName_abi_cxx11_((PLYProperty *)this_00);
    iVar1 = std::__cxx11::string::compare((string *)psVar3);
    if (iVar1 == 0) {
      local_18 = std::
                 vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                 ::operator[]((vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                               *)(in_RDI + 0x28),local_20);
    }
  }
  return local_18;
}

Assistant:

PLYProperty *PLYElement::findProperty(const std::string &s)
{
  PLYProperty *ret=0;

  for (size_t i=0; i<list.size() && ret == 0; i++)
  {
    if (list[i].getName().compare(s) == 0)
    {
      ret=&list[i];
    }
  }

  return ret;
}